

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

StaticAssertion * __thiscall
soul::PoolAllocator::
allocate<soul::AST::StaticAssertion,soul::AST::Context_const&,soul::pool_ref<soul::AST::Expression>&,std::__cxx11::string>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::Expression> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  pool_ref<soul::AST::Expression> *c;
  Context *this_00;
  Expression *failureCondition;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_65 [13];
  string local_58;
  StaticAssertion *local_38;
  StaticAssertion *newObject;
  PoolItem *newItem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  pool_ref<soul::AST::Expression> *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (pool_ref<soul::AST::Expression> *)args;
  args_local = (Context *)this;
  newObject = (StaticAssertion *)allocateSpaceForObject(this,0x58);
  c = args_local_1;
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  failureCondition = pool_ref::operator_cast_to_Expression_((pool_ref *)args_local_2);
  std::__cxx11::string::string((string *)&local_58,(string *)newItem);
  AST::StaticAssertion::StaticAssertion
            ((StaticAssertion *)this_00,(Context *)c,failureCondition,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_38 = (StaticAssertion *)this_00;
  pDVar1 = allocate(soul::AST::Context_const&,soul::pool_ref&,std::__cxx11::string&&)::
           {lambda(void*)#1}::operator_cast_to_function_pointer(local_65);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }